

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main_impl.h
# Opt level: O1

int secp256k1_pedersen_commit_sum
              (secp256k1_context *ctx,secp256k1_pedersen_commitment *commit_out,
              secp256k1_pedersen_commitment **commits,size_t pcnt,
              secp256k1_pedersen_commitment **ncommits,size_t ncnt)

{
  size_t sVar1;
  bool bVar2;
  secp256k1_gej accj;
  secp256k1_ge add;
  secp256k1_ge acc;
  secp256k1_gej local_168;
  secp256k1_ge local_e0;
  secp256k1_ge local_88;
  
  local_168.infinity = 1;
  local_168.x.n[0] = 0;
  local_168.x.n[1] = 0;
  local_168.x.n[2] = 0;
  local_168.x.n[3] = 0;
  local_168.x.n[4] = 0;
  local_168.y.n[0] = 0;
  local_168.y.n[1] = 0;
  local_168.y.n[2] = 0;
  local_168.y.n[3] = 0;
  local_168.y.n[4] = 0;
  local_168.z.n[0] = 0;
  local_168.z.n[1] = 0;
  local_168.z.n[2] = 0;
  local_168.z.n[3] = 0;
  local_168.z.n[4] = 0;
  if (ncnt != 0) {
    sVar1 = 0;
    do {
      secp256k1_pedersen_commitment_load(&local_e0,ncommits[sVar1]);
      secp256k1_gej_add_ge_var(&local_168,&local_168,&local_e0,(secp256k1_fe *)0x0);
      sVar1 = sVar1 + 1;
    } while (ncnt != sVar1);
  }
  secp256k1_gej_neg(&local_168,&local_168);
  if (pcnt != 0) {
    sVar1 = 0;
    do {
      secp256k1_pedersen_commitment_load(&local_e0,commits[sVar1]);
      secp256k1_gej_add_ge_var(&local_168,&local_168,&local_e0,(secp256k1_fe *)0x0);
      sVar1 = sVar1 + 1;
    } while (pcnt != sVar1);
  }
  bVar2 = local_168.infinity == 0;
  if (bVar2) {
    secp256k1_ge_set_gej(&local_88,&local_168);
    secp256k1_pedersen_commitment_save(commit_out,&local_88);
  }
  return (uint)bVar2;
}

Assistant:

int secp256k1_pedersen_commit_sum(const secp256k1_context* ctx, secp256k1_pedersen_commitment *commit_out,
 const secp256k1_pedersen_commitment * const* commits, size_t pcnt, const secp256k1_pedersen_commitment * const* ncommits, size_t ncnt) {
    secp256k1_gej accj;
    secp256k1_ge add;
    size_t i;
    int ret = 0;
    VERIFY_CHECK(ctx != NULL);
    ARG_CHECK(!pcnt || (commits != NULL));
    ARG_CHECK(!ncnt || (ncommits != NULL));
    ARG_CHECK(commit_out != NULL);
    (void) ctx;
    secp256k1_gej_set_infinity(&accj);
    for (i = 0; i < ncnt; i++) {
        secp256k1_pedersen_commitment_load(&add, ncommits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    secp256k1_gej_neg(&accj, &accj);
    for (i = 0; i < pcnt; i++) {
        secp256k1_pedersen_commitment_load(&add, commits[i]);
        secp256k1_gej_add_ge_var(&accj, &accj, &add, NULL);
    }
    if (!secp256k1_gej_is_infinity(&accj)) {
        secp256k1_ge acc;
        secp256k1_ge_set_gej(&acc, &accj);
        secp256k1_pedersen_commitment_save(commit_out, &acc);
        ret = 1;
    }
    return ret;
}